

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Microdisc.cpp
# Opt level: O2

void __thiscall
Oric::Microdisc::set_control_register(Microdisc *this,uint8_t control,uint8_t changes)

{
  bool bVar1;
  byte bVar2;
  Delegate *pDVar3;
  PagedItem item;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  item = BASIC;
  if ((changes & 0x60) != 0) {
    Storage::Disk::Controller::set_drive((Controller *)this,1 << (control >> 5) & 3);
  }
  if ((changes & 0x10) != 0) {
    local_48._8_8_ = 0;
    local_48._1_7_ = 0;
    local_48._M_pod_data[0] = control >> 4 & 1;
    local_30 = std::
               _Function_handler<void_(Storage::Disk::Drive_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Oric/Microdisc.cpp:42:18)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(Storage::Disk::Drive_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Oric/Microdisc.cpp:42:18)>
               ::_M_manager;
    Storage::Disk::Controller::for_all_drives
              ((Controller *)this,
               (function<void_(Storage::Disk::Drive_&,_unsigned_long)> *)&local_48);
    std::_Function_base::~_Function_base((_Function_base *)&local_48);
  }
  if ((changes & 8) != 0) {
    Storage::Disk::MFMController::set_is_double_density((MFMController *)this,(control & 8) == 0);
  }
  if ((changes & 1) != 0) {
    bVar1 = (this->super_DiskController).super_WD1770.status_.interrupt_request;
    bVar2 = (this->super_DiskController).field_0x4e5;
    (this->super_DiskController).field_0x4e5 = control & 1;
    if (((control & 1 & bVar1) != (bVar2 & bVar1)) &&
       (pDVar3 = (this->super_DiskController).delegate_, pDVar3 != (Delegate *)0x0)) {
      (**(pDVar3->super_Delegate)._vptr_Delegate)(pDVar3,this);
    }
  }
  if ((changes & 0x82) != 0) {
    if ((control & 2) == 0) {
      item = (PagedItem)(control >> 6 & 2);
    }
    DiskController::set_paged_item(&this->super_DiskController,item);
  }
  return;
}

Assistant:

void Microdisc::set_control_register(uint8_t control, uint8_t changes) {
	// b2: data separator clock rate select (1 = double)	[TODO]

	// b65: drive select
	if((changes >> 5)&3) {
		set_drive(1 << (control >> 5)&3);
	}

	// b4: side select
	if(changes & 0x10) {
		const int head = (control & 0x10) >> 4;
		for_all_drives([head] (Storage::Disk::Drive &drive, size_t) {
			drive.set_head(head);
		});
	}

	// b3: double density select (0 = double)
	if(changes & 0x08) {
		set_is_double_density(!(control & 0x08));
	}

	// b0: IRQ enable
	if(changes & 0x01) {
		const bool had_irq = get_interrupt_request_line();
		irq_enable_ = bool(control & 0x01);
		const bool has_irq = get_interrupt_request_line();
		if(has_irq != had_irq && delegate_) {
			delegate_->wd1770_did_change_output(this);
		}
	}

	// b7: EPROM select (0 = select)
	// b1: ROM disable (0 = disable)
	if(changes & 0x82) {
		PagedItem item;
		if(control & 0x02) item = PagedItem::BASIC;
		else if(control & 0x80) {
			item = PagedItem::RAM;
		} else {
			item = PagedItem::DiskROM;
		}
		set_paged_item(item);
	}
}